

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  bool bVar1;
  BaseRefVectorOf<char16_t> *pBVar2;
  char cVar3;
  undefined7 uVar11;
  size_t sVar4;
  XMLGrammarPoolImpl *pXVar5;
  undefined8 uVar6;
  char16_t *pcVar7;
  char *pcVar8;
  long *plVar9;
  XSNamedMap<xercesc_4_0::XSObject> *pXVar10;
  XMLSize_t getAt;
  ulong uVar12;
  long lVar13;
  StrX *pSVar14;
  bool updatedXSModel;
  SCMPrintHandler handler;
  ifstream fin;
  char fURI [1000];
  undefined1 auStack_688 [8];
  long *local_680;
  BaseRefVectorOf<char16_t> *local_678;
  XMLGrammarPoolImpl *local_670;
  undefined1 local_661;
  ulong local_660;
  undefined **local_658;
  undefined **local_650;
  undefined **local_648;
  undefined **local_640;
  undefined **local_638;
  undefined **local_630;
  char local_628;
  long local_620 [4];
  byte abStack_600 [488];
  StrX local_418 [125];
  
  if (1 < argC) {
    uVar12 = 0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    lVar13 = 0;
    local_670 = (XMLGrammarPoolImpl *)0x0;
    local_678 = (BaseRefVectorOf<char16_t> *)0x0;
    do {
      pcVar8 = argV[lVar13 + 1];
      if (*pcVar8 != '-') {
        if (argC + -2 == (int)lVar13) {
          pXVar5 = (XMLGrammarPoolImpl *)xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar12);
          xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl
                    (pXVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_680 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                        (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                         (XMLGrammarPool *)pXVar5);
          (**(code **)(*local_680 + 0x60))(local_680,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
          (**(code **)(*local_680 + 0x60))(local_680,&xercesc_4_0::XMLUni::fgXercesSchema,1);
          (**(code **)(*local_680 + 0x60))
                    (local_680,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
          (**(code **)(*local_680 + 0x60))
                    (local_680,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,(byte)local_670 & 1)
          ;
          (**(code **)(*local_680 + 0x60))
                    (local_680,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,0);
          (**(code **)(*local_680 + 0x60))(local_680,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
          (**(code **)(*local_680 + 0x60))(local_680,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
          (**(code **)(*local_680 + 0x68))
                    (local_680,&xercesc_4_0::XMLUni::fgXercesScannerName,
                     &xercesc_4_0::XMLUni::fgSGXMLScanner);
          local_658 = &PTR__SCMPrintHandler_00109920;
          local_650 = &PTR__SCMPrintHandler_00109a38;
          local_648 = &PTR__SCMPrintHandler_00109a70;
          local_640 = &PTR__SCMPrintHandler_00109ae8;
          local_638 = &PTR__SCMPrintHandler_00109b28;
          local_630 = &PTR__SCMPrintHandler_00109b80;
          local_628 = '\0';
          local_670 = pXVar5;
          (**(code **)(*local_680 + 0x58))();
          std::ifstream::ifstream(local_620);
          if (((ulong)local_678 & 1) != 0) {
            std::ifstream::open((char *)local_620,(_Ios_Openmode)argV[lVar13 + 1]);
          }
          if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 5) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
            pcVar8 = argV[lVar13 + 1];
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b1f0);
            }
            else {
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar4)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::ifstream::~ifstream(local_620);
            return 3;
          }
          local_660 = 0;
          goto LAB_00104de9;
        }
        break;
      }
      if ((pcVar8[1] == '?') && (pcVar8[2] == '\0')) break;
      uVar11 = (undefined7)((ulong)pcVar8 >> 8);
      if (((pcVar8[1] == 'l') && (pcVar8[2] == '\0')) || ((pcVar8[1] == 'L' && (pcVar8[2] == '\0')))
         ) {
        local_678 = (BaseRefVectorOf<char16_t> *)CONCAT71(uVar11,1);
      }
      else if (((pcVar8[1] == 'f') && (pcVar8[2] == '\0')) ||
              ((pcVar8[1] == 'F' && (pcVar8[2] == '\0')))) {
        local_670 = (XMLGrammarPoolImpl *)CONCAT71(uVar11,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option \'",0x10);
        pcVar8 = argV[lVar13 + 1];
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b1f0);
        }
        else {
          sVar4 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\', ignoring it\n",0xf);
        cVar3 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        uVar12 = (ulong)(uint)(int)cVar3;
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      lVar13 = lVar13 + 1;
    } while ((ulong)(uint)argC - 1 != lVar13);
  }
  usage();
  return 1;
LAB_00104de9:
  do {
    pBVar2 = local_678;
    memset(local_418,0,1000);
    if (((ulong)pBVar2 & 1) == 0) {
      pSVar14 = (StrX *)argV[lVar13 + 1];
LAB_00104eb5:
      uVar6 = (**(code **)(*local_680 + 0x138))(local_680,pSVar14,1,1);
      if (local_628 == '\x01') {
        local_628 = '\0';
      }
      else {
        local_660 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
    }
    else {
      if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 2) != 0) break;
      std::ios::widen((char)auStack_688 + (char)*(long *)(local_620[0] + -0x18) + 'h');
      std::istream::getline((char *)local_620,(long)local_418,-0x18);
      if ((char)local_418[0].fLocalForm != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"==Parsing== ",0xc)
        ;
        sVar4 = strlen((char *)local_418);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)local_418,sVar4);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        pSVar14 = local_418;
        goto LAB_00104eb5;
      }
    }
  } while (((ulong)local_678 & 1) != 0);
  if ((local_660 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information"
               ,0x5d);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"********** Printing out information from Schema **********",
               0x3a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
    lVar13 = (**(code **)(*(long *)local_670 + 0x68))(local_670,&local_661);
    if (lVar13 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No XSModel to print",0x13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
    }
    else {
      local_678 = *(BaseRefVectorOf<char16_t> **)(lVar13 + 8);
      if (*(long *)(local_678 + 0x10) != 0) {
        getAt = 0;
        uVar12 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Processing Namespace:   ",0x18);
          pcVar7 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(local_678,getAt);
          if ((pcVar7 != (char16_t *)0x0) && (*pcVar7 != L'\0')) {
            pcVar8 = (char *)xercesc_4_0::XMLString::transcode
                                       (pcVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            local_418[0].fLocalForm = pcVar8;
            if (pcVar8 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b0b8);
            }
            else {
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4)
              ;
            }
            StrX::~StrX(local_418);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\n============================================",0x2d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
          std::ostream::put(-0x48);
          plVar9 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          pXVar10 = (XSNamedMap<xercesc_4_0::XSObject> *)
                    xercesc_4_0::XSModel::getComponentsByNamespace
                              ((COMPONENT_TYPE)lVar13,(wchar16 *)0x2);
          processElements(pXVar10);
          pXVar10 = (XSNamedMap<xercesc_4_0::XSObject> *)
                    xercesc_4_0::XSModel::getComponentsByNamespace
                              ((COMPONENT_TYPE)lVar13,(wchar16 *)0x3);
          processTypeDefinitions(pXVar10);
          bVar1 = uVar12 < *(ulong *)(local_678 + 0x10);
          getAt = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar1);
      }
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::ifstream::~ifstream(local_620);
  pXVar5 = local_670;
  if (local_680 != (long *)0x0) {
    (**(code **)(*local_680 + 8))();
  }
  if (pXVar5 != (XMLGrammarPoolImpl *)0x0) {
    (**(code **)(*(long *)pXVar5 + 8))(pXVar5);
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 0;
}

Assistant:

int main(int argC, char* argV[])
{
    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // cannot return out of catch-blocks lest exception-destruction
    // result in calls to destroyed memory handler!
    int errorCode = 0;
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cerr   << "Error during initialization! Message:\n"
        << StrX(toCatch.getMessage()) << std::endl;
        errorCode = 2;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    bool							doList				= false;
    bool							schemaFullChecking	= false;
    const char*                     xsdFile             = 0;
    int argInd;

    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 1;
        }
        else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
        else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    XMLGrammarPool *grammarPool = 0;
    SAX2XMLReader* parser = 0;
    try
    {
        grammarPool = new XMLGrammarPoolImpl(XMLPlatformUtils::fgMemoryManager);

        parser = XMLReaderFactory::createXMLReader(XMLPlatformUtils::fgMemoryManager, grammarPool);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
        parser->setFeature(XMLUni::fgXercesSchema, true);
        parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, false);
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
        parser->setProperty(XMLUni::fgXercesScannerName, (void *)XMLUni::fgSGXMLScanner);

        SCMPrintHandler handler;
        parser->setErrorHandler(&handler);

        bool more = true;
        bool parsedOneSchemaOkay = false;
        std::ifstream fin;

        // the input is a list file
        if (doList)
            fin.open(argV[argInd]);

        if (fin.fail()) {
            std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
            return 3;
        }

        while (more)
        {
            char fURI[1000];
            //initialize the array to zeros
            memset(fURI,0,sizeof(fURI));

            if (doList) {
                if (! fin.eof() ) {
                    fin.getline (fURI, sizeof(fURI));
                    if (!*fURI)
                        continue;
                    else {
                        xsdFile = fURI;
                        std::cerr << "==Parsing== " << xsdFile << std::endl;
                    }
                }
                else
                    break;
            }
            else {
                xsdFile = argV[argInd];
                more = false;
            }

            parser->loadGrammar(xsdFile, Grammar::SchemaGrammarType, true);
            if (handler.getSawErrors())
            {
                handler.resetErrors();
            }
            else
            {
                parsedOneSchemaOkay = true;
            }
        }

        if (parsedOneSchemaOkay)
        {
            std::cout << "********** Printing out information from Schema **********" << "\n\n";
            bool updatedXSModel;
            XSModel *xsModel = grammarPool->getXSModel(updatedXSModel);
            if (xsModel)
            {
                StringList *namespaces = xsModel->getNamespaces();
                for (unsigned i = 0; i < namespaces->size(); i++) {

                    std::cout << "Processing Namespace:   ";
                    const XMLCh *nameSpace = namespaces->elementAt(i);
                    if (nameSpace && *nameSpace)
                        std::cout << StrX(nameSpace);
                    std::cout << "\n============================================" << std::endl << std::endl;

                    processElements(xsModel->getComponentsByNamespace(XSConstants::ELEMENT_DECLARATION,
                                                                  nameSpace));
                    processTypeDefinitions(xsModel->getComponentsByNamespace(XSConstants::TYPE_DEFINITION,
                                                                         nameSpace));
                }
            }
            else
            {
                std::cout << "No XSModel to print" << "\n\n";
            }
        }
        else
        {
            std::cout << "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information";
        }

        std::cout << std::endl;
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 6;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xsdFile << "'\n"
        << "Exception message is:  \n"
        << StrX(e.getMessage()) << std::endl;
        errorCode = 4;
    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 5;
    }

    delete parser;
    delete grammarPool;
    XMLPlatformUtils::Terminate();

    return errorCode;
}